

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O2

ChebyshevExpansion * __thiscall
ChebTools::ChebyshevExpansion::apply
          (ChebyshevExpansion *__return_storage_ptr__,ChebyshevExpansion *this,
          function<Eigen::Array<double,__1,_1,_0,__1,_1>_(const_Eigen::Array<double,__1,_1,_0,__1,_1>_&)>
          *f)

{
  MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *this_00;
  void *local_80 [2];
  vectype local_70;
  double *local_60;
  _Any_data local_50;
  _Any_data *local_40;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::MatrixWrapper<Eigen::Array<double,__1,_1,_0,__1,_1>_>,_0>
  local_38;
  
  this_00 = (MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)
            LMatrixLibrary::get((LMatrixLibrary *)l_matrix_library,
                                (this->m_c).
                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                m_storage.m_rows - 1);
  get_node_function_values((ChebyshevExpansion *)&local_60);
  Eigen::PlainObjectBase<Eigen::Array<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((PlainObjectBase<Eigen::Array<double,_1,1,0,_1,1>> *)local_80,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_60);
  std::
  function<Eigen::Array<double,_-1,_1,_0,_-1,_1>_(const_Eigen::Array<double,_-1,_1,_0,_-1,_1>_&)>::
  operator()((function<Eigen::Array<double,__1,_1,_0,__1,_1>_(const_Eigen::Array<double,__1,_1,_0,__1,_1>_&)>
              *)&local_50,(Array<double,__1,_1,_0,__1,_1> *)f);
  local_40 = &local_50;
  local_38 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                       (this_00,(MatrixBase<Eigen::MatrixWrapper<Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
                                 *)&local_40);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::MatrixWrapper<Eigen::Array<double,_1,1,0,_1,1>>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_70,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::MatrixWrapper<Eigen::Array<double,__1,_1,_0,__1,_1>_>,_0>_>
              *)&local_38);
  ChebyshevExpansion(__return_storage_ptr__,&local_70,this->m_xmin,this->m_xmax);
  free(local_70.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(local_50._M_unused._M_object);
  free(local_80[0]);
  free(local_60);
  return __return_storage_ptr__;
}

Assistant:

ChebyshevExpansion ChebyshevExpansion::apply(std::function<Eigen::ArrayXd(const Eigen::ArrayXd &)> &f) const{
        // 1. Transform Chebyshev-Lobatto node function values by the function f(y) -> y2
        // 2. Go backwards to coefficients from node values c2 = V*y2
        const auto Ndegree = m_c.size()-1;
        const Eigen::MatrixXd &V = l_matrix_library.get(Ndegree);
        return ChebyshevExpansion(V*f(get_node_function_values()).matrix(), xmin(), xmax());
    }